

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void resolveOutOfRangeError(Parse *pParse,char *zType,int i,int mx,Expr *pError)

{
  sqlite3ErrorMsg(pParse,"%r %s BY term out of range - should be between 1 and %d",i,zType,
                  (ulong)(uint)mx);
  sqlite3RecordErrorOffsetOfExpr(pParse->db,pError);
  return;
}

Assistant:

static void resolveOutOfRangeError(
  Parse *pParse,         /* The error context into which to write the error */
  const char *zType,     /* "ORDER" or "GROUP" */
  int i,                 /* The index (1-based) of the term out of range */
  int mx,                /* Largest permissible value of i */
  Expr *pError           /* Associate the error with the expression */
){
  sqlite3ErrorMsg(pParse,
    "%r %s BY term out of range - should be "
    "between 1 and %d", i, zType, mx);
  sqlite3RecordErrorOffsetOfExpr(pParse->db, pError);
}